

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall kj::HttpServer::drain(HttpServer *this)

{
  PromiseFulfiller<void> *pPVar1;
  Own<kj::PromiseFulfiller<void>_> *t;
  Promise<void> *pPVar2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  long in_RSI;
  Promise<void> PVar4;
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> local_60;
  undefined1 local_50 [8];
  PromiseFulfillerPair<void> paf;
  Fault local_20;
  Fault f;
  HttpServer *this_local;
  
  if (((*(byte *)(in_RSI + 0x50) ^ 0xff) & 1) == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x13b6,FAILED,"!draining","\"you can only call drain() once\"",
               (char (*) [31])"you can only call drain() once");
    _::Debug::Fault::fatal(&local_20);
  }
  *(undefined1 *)(in_RSI + 0x50) = 1;
  pPVar1 = Own<kj::PromiseFulfiller<void>_>::operator->
                     ((Own<kj::PromiseFulfiller<void>_> *)(in_RSI + 0x68));
  (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,(undefined1 *)((long)&paf.fulfiller.ptr + 3));
  if (*(int *)(in_RSI + 0x78) == 0) {
    Promise<void>::Promise((Promise<void> *)this);
    pPVar3 = extraout_RDX;
  }
  else {
    newPromiseAndFulfiller<void>();
    t = mv<kj::Own<kj::PromiseFulfiller<void>>>
                  ((Own<kj::PromiseFulfiller<void>_> *)&paf.promise.super_PromiseBase.node.ptr);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&local_60,t);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)(in_RSI + 0x80),&local_60);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&local_60);
    pPVar2 = mv<kj::Promise<void>>((Promise<void> *)local_50);
    Promise<void>::Promise((Promise<void> *)this,pPVar2);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_50);
    pPVar3 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> HttpServer::drain() {
  KJ_REQUIRE(!draining, "you can only call drain() once");

  draining = true;
  drainFulfiller->fulfill();

  if (connectionCount == 0) {
    return kj::READY_NOW;
  } else {
    auto paf = kj::newPromiseAndFulfiller<void>();
    zeroConnectionsFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}